

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneNamesImpl::ZoneStringsLoader::ZoneStringsLoader
          (ZoneStringsLoader *this,TimeZoneNamesImpl *_tzn,UErrorCode *status)

{
  UBool UVar1;
  UHashtable *pUVar2;
  UErrorCode *status_local;
  TimeZoneNamesImpl *_tzn_local;
  ZoneStringsLoader *this_local;
  
  ResourceSink::ResourceSink(&this->super_ResourceSink);
  (this->super_ResourceSink).super_UObject._vptr_UObject =
       (_func_int **)&PTR__ZoneStringsLoader_004aa070;
  this->tzn = _tzn;
  pUVar2 = uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,status);
  this->keyToLoader = pUVar2;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    uhash_setKeyDeleter_63(this->keyToLoader,uprv_free_63);
    uhash_setValueDeleter_63(this->keyToLoader,deleteZNamesLoader);
  }
  return;
}

Assistant:

ZoneStringsLoader(TimeZoneNamesImpl& _tzn, UErrorCode& status)
            : tzn(_tzn) {
        keyToLoader = uhash_open(uhash_hashChars, uhash_compareChars, NULL, &status);
        if (U_FAILURE(status)) { return; }
        uhash_setKeyDeleter(keyToLoader, uprv_free);
        uhash_setValueDeleter(keyToLoader, deleteZNamesLoader);
    }